

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeEntryPointData.cpp
# Opt level: O0

void __thiscall
NativeEntryPointData::SetTJNativeAddress
          (NativeEntryPointData *this,JavascriptMethod nativeAddress,void *validationCookie)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void **ppvVar4;
  void *validationCookie_local;
  JavascriptMethod nativeAddress_local;
  NativeEntryPointData *this_local;
  
  if (this->nativeAddress != (Type)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x61,"(this->nativeAddress == nullptr)","this->nativeAddress == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__
                      ((WriteBarrierPtr *)&this->validationCookie);
  if (*ppvVar4 != (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeEntryPointData.cpp"
                       ,0x62,"(this->validationCookie == nullptr)",
                       "this->validationCookie == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this->nativeAddress = (Type)nativeAddress;
  Memory::WriteBarrierPtr<void>::operator=(&this->validationCookie,validationCookie);
  return;
}

Assistant:

void
NativeEntryPointData::SetTJNativeAddress(Js::JavascriptMethod nativeAddress, void * validationCookie)
{
    Assert(this->nativeAddress == nullptr);
    Assert(this->validationCookie == nullptr);
    this->nativeAddress = nativeAddress;
    this->validationCookie = validationCookie;
}